

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ClampWindowRect(ImGuiWindow *window,ImRect *visibility_rect)

{
  float fVar1;
  ImVec2 IVar2;
  ImVec2 local_38 [2];
  ImVec2 local_28;
  ImVec2 size_for_clamping;
  ImGuiContext *g;
  ImRect *visibility_rect_local;
  ImGuiWindow *window_local;
  
  size_for_clamping = (ImVec2)GImGui;
  local_28 = window->Size;
  if ((((GImGui->IO).ConfigWindowsMoveFromTitleBarOnly & 1U) != 0) && ((window->Flags & 1U) == 0)) {
    fVar1 = ImGuiWindow::TitleBarHeight(window);
    local_28.y = fVar1;
  }
  local_38[0] = operator-(&visibility_rect->Min,&local_28);
  IVar2 = ImClamp(&window->Pos,local_38,visibility_rect->Max);
  window->Pos = IVar2;
  return;
}

Assistant:

static inline void ClampWindowRect(ImGuiWindow* window, const ImRect& visibility_rect)
{
    ImGuiContext& g = *GImGui;
    ImVec2 size_for_clamping = window->Size;
    if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(window->Flags & ImGuiWindowFlags_NoTitleBar))
        size_for_clamping.y = window->TitleBarHeight();
    window->Pos = ImClamp(window->Pos, visibility_rect.Min - size_for_clamping, visibility_rect.Max);
}